

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCaseTracking::SectionTracker::tryOpen(SectionTracker *this)

{
  pointer pbVar1;
  size_t __n;
  ITracker *pIVar2;
  int iVar3;
  
  iVar3 = (*(this->super_TrackerBase).super_ITracker.super_SharedImpl<Catch::IShared>.super_IShared.
            super_NonCopyable._vptr_NonCopyable[5])();
  if ((char)iVar3 != '\0') {
    return;
  }
  pbVar1 = (this->m_filters).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pbVar1 != (this->m_filters).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (__n = pbVar1->_M_string_length, __n != 0)) {
    if (__n != (this->super_TrackerBase).m_nameAndLocation.name._M_string_length) {
      return;
    }
    iVar3 = bcmp((pbVar1->_M_dataplus)._M_p,
                 (this->super_TrackerBase).m_nameAndLocation.name._M_dataplus._M_p,__n);
    if (iVar3 != 0) {
      return;
    }
  }
  (this->super_TrackerBase).m_runState = Executing;
  ((this->super_TrackerBase).m_ctx)->m_currentTracker = (ITracker *)this;
  pIVar2 = (this->super_TrackerBase).m_parent;
  if (pIVar2 == (ITracker *)0x0) {
    return;
  }
  (*(pIVar2->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
    [0xf])();
  return;
}

Assistant:

void tryOpen() {
            if( !isComplete() && (m_filters.empty() || m_filters[0].empty() ||  m_filters[0] == m_nameAndLocation.name ) )
                open();
        }